

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void MouseCursorPosCallback(GLFWwindow *window,double x,double y)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  GestureEvent in_stack_ffffffffffffff28;
  undefined8 local_68 [6];
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  CORE.Input.Mouse.currentPosition.x = (float)x;
  CORE.Input.Mouse.currentPosition.y = (float)y;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = CORE.Input.Mouse.currentPosition.x;
  auVar4._4_4_ = CORE.Input.Mouse.currentPosition.y;
  uStack_38 = 0;
  local_10 = 0;
  uStack_8 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[0] = 0x100000002;
  auVar5._4_4_ = (float)(int)CORE.Window.screen.height;
  auVar5._0_4_ = (float)(int)CORE.Window.screen.width;
  auVar5._8_8_ = 0;
  auVar5 = divps(auVar4,auVar5);
  local_68[5] = auVar5._0_8_;
  puVar2 = local_68;
  puVar3 = (undefined8 *)&stack0xffffffffffffff28;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  CORE.Input.Touch.position[0] = CORE.Input.Mouse.currentPosition;
  ProcessGestureEvent(in_stack_ffffffffffffff28);
  return;
}

Assistant:

static void MouseCursorPosCallback(GLFWwindow *window, double x, double y)
{
    CORE.Input.Mouse.currentPosition.x = (float)x;
    CORE.Input.Mouse.currentPosition.y = (float)y;
    CORE.Input.Touch.position[0] = CORE.Input.Mouse.currentPosition;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    gestureEvent.touchAction = TOUCH_ACTION_MOVE;

    // Assign a pointer ID
    gestureEvent.pointId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = CORE.Input.Touch.position[0];

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures-system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}